

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O3

int Am_Set_Old_Owner_To_Me_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Wrapper *value_00;
  bool bVar2;
  Am_Object cmd;
  Am_Value value;
  Am_Object local_28;
  Am_Value local_20;
  
  local_20.type = 0;
  local_20.value.wrapper_value = (Am_Wrapper *)0x0;
  in_value = Am_Object::Get(self,0xc5,1);
  Am_Value::operator=(&local_20,in_value);
  bVar1 = Am_Value::Valid(&local_20);
  bVar2 = local_20.type == 0xa001;
  if (bVar1 && bVar2) {
    local_28.data = (Am_Object_Data *)0x0;
    Am_Object::operator=(&local_28,&local_20);
    value_00 = Am_Object::operator_cast_to_Am_Wrapper_(self);
    Am_Object::Set(&local_28,0x170,value_00,1);
    Am_Object::~Am_Object(&local_28);
  }
  Am_Value::~Am_Value(&local_20);
  return (uint)(bVar1 && bVar2);
}

Assistant:

Am_Define_Formula(int, Am_Set_Old_Owner_To_Me)
{
  Am_Value value;
  value = self.Peek(Am_COMMAND);
  if (value.Valid() && value.type == Am_OBJECT) {
    Am_Object cmd;
    cmd = value;
    cmd.Set(Am_SAVED_OLD_OWNER, self, Am_OK_IF_NOT_THERE);
    return 1;
  }
  return 0;
}